

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O3

void __thiscall
icu_63::DecimalFormat::applyLocalizedPattern
          (DecimalFormat *this,UnicodeString *localizedPattern,UErrorCode *status)

{
  UnicodeString pattern;
  UnicodeString UStack_58;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    icu_63::number::impl::PatternStringUtils::convertLocalized
              (&UStack_58,localizedPattern,
               (this->fields->symbols).super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>.
               ptr,false,status);
    (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x50])
              (this,&UStack_58,status);
    UnicodeString::~UnicodeString(&UStack_58);
  }
  return;
}

Assistant:

void DecimalFormat::setSignAlwaysShown(UBool value) {
    if (UBOOL_TO_BOOL(value) == fields->properties->signAlwaysShown) { return; }
    fields->properties->signAlwaysShown = value;
    touchNoError();
}